

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void notdirty_write(CPUState *cpu,vaddr mem_vaddr,uint size,CPUIOTLBEntry *iotlbentry,
                   uintptr_t retaddr)

{
  _Bool _Var1;
  ram_addr_t addr;
  page_collection *pages_00;
  page_collection *pages;
  ram_addr_t ram_addr;
  uintptr_t retaddr_local;
  CPUIOTLBEntry *iotlbentry_local;
  uint size_local;
  vaddr mem_vaddr_local;
  CPUState *cpu_local;
  
  addr = mem_vaddr + iotlbentry->addr;
  _Var1 = cpu_physical_memory_get_dirty_flag(addr,1);
  if (!_Var1) {
    pages_00 = page_collection_lock_tricore((uc_struct_conflict15 *)cpu->uc,addr,addr + size);
    tb_invalidate_phys_page_fast_tricore((uc_struct_conflict15 *)cpu->uc,pages_00,addr,size,retaddr)
    ;
    page_collection_unlock_tricore(pages_00);
  }
  cpu_physical_memory_set_dirty_range(addr,(ulong)size,'\x05');
  _Var1 = cpu_physical_memory_is_clean(addr);
  if (!_Var1) {
    tlb_set_dirty_tricore(cpu,(target_ulong_conflict)mem_vaddr);
  }
  return;
}

Assistant:

static void notdirty_write(CPUState *cpu, vaddr mem_vaddr, unsigned size,
                           CPUIOTLBEntry *iotlbentry, uintptr_t retaddr)
{
    ram_addr_t ram_addr = mem_vaddr + iotlbentry->addr;

    // trace_memory_notdirty_write_access(mem_vaddr, ram_addr, size);

    if (!cpu_physical_memory_get_dirty_flag(ram_addr, DIRTY_MEMORY_CODE)) {
        struct page_collection *pages
            = page_collection_lock(cpu->uc, ram_addr, ram_addr + size);
        tb_invalidate_phys_page_fast(cpu->uc, pages, ram_addr, size, retaddr);
        page_collection_unlock(pages);
    }

    /*
     * Set both VGA and migration bits for simplicity and to remove
     * the notdirty callback faster.
     */
    cpu_physical_memory_set_dirty_range(ram_addr, size, DIRTY_CLIENTS_NOCODE);

    /* We remove the notdirty callback only if the code has been flushed. */
    if (!cpu_physical_memory_is_clean(ram_addr)) {
        // trace_memory_notdirty_set_dirty(mem_vaddr);
        tlb_set_dirty(cpu, mem_vaddr);
    }
}